

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O2

Image<unsigned_char> * __thiscall
ObjLoader::NamedTextureImages::operator[](NamedTextureImages *this,string *name)

{
  int iVar1;
  const_iterator cVar2;
  Image<unsigned_char> *pIVar3;
  
  if (operator[](std::__cxx11::string_const&)::defaultImage == '\0') {
    iVar1 = __cxa_guard_acquire(&operator[](std::__cxx11::string_const&)::defaultImage);
    if (iVar1 != 0) {
      operator[]::defaultImage.width = 1;
      operator[]::defaultImage.height = 1;
      operator[]::defaultImage.depth = 1;
      operator[]::defaultImage.channels = 4;
      operator[]::defaultImage.data = white;
      __cxa_guard_release(&operator[](std::__cxx11::string_const&)::defaultImage);
    }
  }
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this,name);
  pIVar3 = &operator[]::defaultImage;
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    pIVar3 = (Image<unsigned_char> *)
             ((long)cVar2.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_true>
                    ._M_cur + 0x28);
  }
  return pIVar3;
}

Assistant:

const Image<> & ObjLoader::NamedTextureImages::operator[](const std::string & name) const
{
  static Image<> defaultImage(white, 1, 1, 4);
  auto searchRes = m_images.find(name);
  if (searchRes != m_images.end()) {
    return searchRes->second;
  }
  return defaultImage;
}